

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

ostream * argparse::operator<<(ostream *stream,ArgumentParser *parser)

{
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *plVar1;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *plVar2;
  size_type sVar3;
  ostream *poVar4;
  size_t sVar5;
  _List_node_base *p_Var6;
  char *pcVar7;
  list<argparse::Argument,_std::allocator<argparse::Argument>_> *__range3;
  bool bVar8;
  sentry sen;
  sentry local_40 [16];
  
  std::ostream::sentry::sentry(local_40,stream);
  if (local_40[0] == (sentry)0x1) {
    *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) =
         *(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x18) | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(stream,"Usage: ",7);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,(parser->mProgramName)._M_dataplus._M_p,
                        (parser->mProgramName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," [options] ",0xb);
    sVar5 = ArgumentParser::get_length_of_longest_argument(parser);
    plVar1 = &parser->mPositionalArguments;
    p_Var6 = (_List_node_base *)plVar1;
    while (p_Var6 = (((_List_base<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                     &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)plVar1) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,*(char **)p_Var6[1]._M_next,*(long *)((long)p_Var6[1]._M_next + 8))
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\n\n",2);
    sVar3 = (parser->mDescription)._M_string_length;
    if (sVar3 != 0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,(parser->mDescription)._M_dataplus._M_p,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
    }
    p_Var6 = (_List_node_base *)plVar1;
    if ((plVar1->super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>)._M_impl.
        _M_node.super__List_node_base._M_next != (_List_node_base *)plVar1) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"Positional arguments:\n",0x16);
    }
    while (p_Var6 = (((_List_base<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                     &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)plVar1) {
      *(size_t *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10) = sVar5;
      operator<<(stream,(Argument *)(p_Var6 + 1));
    }
    plVar2 = &parser->mOptionalArguments;
    p_Var6 = (_List_node_base *)plVar2;
    if ((parser->mOptionalArguments).
        super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)plVar2) {
      bVar8 = (plVar1->super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>).
              _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)plVar1;
      pcVar7 = "";
      if (bVar8) {
        pcVar7 = "\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar7,(ulong)bVar8);
      std::__ostream_insert<char,std::char_traits<char>>(stream,"Optional arguments:\n",0x14);
    }
    while (p_Var6 = (((_List_base<argparse::Argument,_std::allocator<argparse::Argument>_> *)
                     &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)plVar2) {
      *(size_t *)(stream + *(long *)(*(long *)stream + -0x18) + 0x10) = sVar5;
      operator<<(stream,(Argument *)(p_Var6 + 1));
    }
    sVar3 = (parser->mEpilog)._M_string_length;
    if (sVar3 != 0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (stream,(parser->mEpilog)._M_dataplus._M_p,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
    }
  }
  std::ostream::sentry::~sentry(local_40);
  return stream;
}

Assistant:

auto operator<<(std::ostream &stream, const ArgumentParser &parser)
        -> std::ostream & {
            if (auto sen = std::ostream::sentry(stream)) {
                stream.setf(std::ios_base::left);
                stream << "Usage: " << parser.mProgramName << " [options] ";
                std::size_t tLongestArgumentLength = parser.get_length_of_longest_argument();

                for (const auto &argument : parser.mPositionalArguments) {
                    stream << argument.mNames.front() << " ";
                }
                stream << "\n\n";

                if (!parser.mDescription.empty())
                    stream << parser.mDescription << "\n\n";

                if (!parser.mPositionalArguments.empty())
                    stream << "Positional arguments:\n";

                for (const auto &mPositionalArgument : parser.mPositionalArguments) {
                    stream.width(tLongestArgumentLength);
                    stream << mPositionalArgument;
                }

                if (!parser.mOptionalArguments.empty())
                    stream << (parser.mPositionalArguments.empty() ? "" : "\n")
                           << "Optional arguments:\n";

                for (const auto &mOptionalArgument : parser.mOptionalArguments) {
                    stream.width(tLongestArgumentLength);
                    stream << mOptionalArgument;
                }

                if (!parser.mEpilog.empty())
                    stream << parser.mEpilog << "\n\n";
            }

            return stream;
        }